

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::DeepScanLineOutputFile::copyPixels(DeepScanLineOutputFile *this,DeepScanLineInputFile *in)

{
  LineOrder LVar1;
  Compression CVar2;
  Int64 sampleCountTableSize;
  Int64 packedDataSize;
  Int64 unpackedDataSize;
  OutputStreamMutex *filedata;
  int iVar3;
  pointer pcVar4;
  bool bVar5;
  int iVar6;
  Header *this_00;
  string *__lhs;
  Box2i *pBVar7;
  Box2i *src;
  LineOrder *pLVar8;
  Compression *pCVar9;
  ChannelList *this_01;
  ChannelList *other;
  Data *pDVar10;
  ArgExc *pAVar11;
  ostream *poVar12;
  char *pcVar13;
  LogicExc *this_02;
  Int64 dataSize;
  Lock local_1c8;
  vector<char,_std::allocator<char>_> data;
  
  local_1c8._mutex = &this->_data->_streamData->super_Mutex;
  std::mutex::lock(local_1c8._mutex);
  local_1c8._locked = true;
  pDVar10 = this->_data;
  this_00 = DeepScanLineInputFile::header(in);
  bVar5 = Header::hasType(this_00);
  if (bVar5) {
    __lhs = Header::type_abi_cxx11_(this_00);
    bVar5 = std::operator!=(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)DEEPSCANLINE_abi_cxx11_);
    if (!bVar5) {
      pBVar7 = Header::dataWindow(&pDVar10->header);
      src = Header::dataWindow(this_00);
      bVar5 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==(pBVar7,src);
      if (!bVar5) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&data);
        poVar12 = std::operator<<((ostream *)
                                  &data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage,
                                  "Cannot copy pixels from image file \"");
        pcVar13 = DeepScanLineInputFile::fileName(in);
        poVar12 = std::operator<<(poVar12,pcVar13);
        poVar12 = std::operator<<(poVar12,"\" to image file \"");
        pcVar13 = fileName(this);
        poVar12 = std::operator<<(poVar12,pcVar13);
        std::operator<<(poVar12,"\". The files have different data windows.");
        pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar11,(stringstream *)&data);
        __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      pLVar8 = Header::lineOrder(&pDVar10->header);
      LVar1 = *pLVar8;
      pLVar8 = Header::lineOrder(this_00);
      if (LVar1 != *pLVar8) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&data);
        poVar12 = std::operator<<((ostream *)
                                  &data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage,
                                  "Quick pixel copy from image file \"");
        pcVar13 = DeepScanLineInputFile::fileName(in);
        poVar12 = std::operator<<(poVar12,pcVar13);
        poVar12 = std::operator<<(poVar12,"\" to image file \"");
        pcVar13 = fileName(this);
        poVar12 = std::operator<<(poVar12,pcVar13);
        std::operator<<(poVar12,"\" failed. The files have different line orders.");
        pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar11,(stringstream *)&data);
        __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      pCVar9 = Header::compression(&pDVar10->header);
      CVar2 = *pCVar9;
      pCVar9 = Header::compression(this_00);
      if (CVar2 != *pCVar9) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&data);
        poVar12 = std::operator<<((ostream *)
                                  &data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage,
                                  "Quick pixel copy from image file \"");
        pcVar13 = DeepScanLineInputFile::fileName(in);
        poVar12 = std::operator<<(poVar12,pcVar13);
        poVar12 = std::operator<<(poVar12,"\" to image file \"");
        pcVar13 = fileName(this);
        poVar12 = std::operator<<(poVar12,pcVar13);
        std::operator<<(poVar12,"\" failed. The files use different compression methods.");
        pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar11,(stringstream *)&data);
        __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      this_01 = Header::channels(&pDVar10->header);
      other = Header::channels(this_00);
      bVar5 = ChannelList::operator==(this_01,other);
      if (bVar5) {
        pBVar7 = Header::dataWindow(&pDVar10->header);
        if (this->_data->missingScanLines == ((pBVar7->max).y - (pBVar7->min).y) + 1) {
          std::vector<char,_std::allocator<char>_>::vector(&data,0x1000,(allocator_type *)&dataSize)
          ;
          pDVar10 = this->_data;
          iVar6 = pDVar10->missingScanLines;
          while (0 < iVar6) {
            dataSize = (long)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start;
            DeepScanLineInputFile::rawPixelData
                      (in,pDVar10->currentScanLine,
                       data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,&dataSize);
            if ((ulong)((long)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start) < dataSize) {
              std::vector<char,_std::allocator<char>_>::resize(&data,dataSize);
              DeepScanLineInputFile::rawPixelData
                        (in,this->_data->currentScanLine,
                         data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,&dataSize);
            }
            pcVar4 = data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            sampleCountTableSize =
                 *(Int64 *)(data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start + 4);
            packedDataSize =
                 *(Int64 *)(data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start + 0xc);
            unpackedDataSize =
                 *(Int64 *)(data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start + 0x14);
            pDVar10 = this->_data;
            filedata = pDVar10->_streamData;
            iVar6 = lineBufferMinY(pDVar10->currentScanLine,pDVar10->minY,pDVar10->linesInBuffer);
            anon_unknown_7::writePixelData
                      (filedata,pDVar10,iVar6,pcVar4 + sampleCountTableSize + 0x1c,packedDataSize,
                       unpackedDataSize,pcVar4 + 0x1c,sampleCountTableSize);
            pDVar10 = this->_data;
            iVar6 = pDVar10->linesInBuffer;
            iVar3 = -iVar6;
            if (pDVar10->lineOrder == INCREASING_Y) {
              iVar3 = iVar6;
            }
            pDVar10->currentScanLine = pDVar10->currentScanLine + iVar3;
            iVar6 = pDVar10->missingScanLines - iVar6;
            pDVar10->missingScanLines = iVar6;
          }
          std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                    (&data.super__Vector_base<char,_std::allocator<char>_>);
          IlmThread_2_5::Lock::~Lock(&local_1c8);
          return;
        }
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&data);
        poVar12 = std::operator<<((ostream *)
                                  &data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage,
                                  "Quick pixel copy from image file \"");
        pcVar13 = DeepScanLineInputFile::fileName(in);
        poVar12 = std::operator<<(poVar12,pcVar13);
        poVar12 = std::operator<<(poVar12,"\" to image file \"");
        pcVar13 = fileName(this);
        poVar12 = std::operator<<(poVar12,pcVar13);
        poVar12 = std::operator<<(poVar12,"\" failed. \"");
        pcVar13 = fileName(this);
        poVar12 = std::operator<<(poVar12,pcVar13);
        std::operator<<(poVar12,"\" already contains pixel data.");
        this_02 = (LogicExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::LogicExc::LogicExc(this_02,(stringstream *)&data);
        __cxa_throw(this_02,&Iex_2_5::LogicExc::typeinfo,Iex_2_5::LogicExc::~LogicExc);
      }
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&data);
      poVar12 = std::operator<<((ostream *)
                                &data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,
                                "Quick pixel copy from image file \"");
      pcVar13 = DeepScanLineInputFile::fileName(in);
      poVar12 = std::operator<<(poVar12,pcVar13);
      poVar12 = std::operator<<(poVar12,"\" to image file \"");
      pcVar13 = fileName(this);
      poVar12 = std::operator<<(poVar12,pcVar13);
      std::operator<<(poVar12,"\" failed.  The files have different channel lists.");
      pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(pAVar11,(stringstream *)&data);
      __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&data);
  poVar12 = std::operator<<((ostream *)
                            &data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,
                            "Cannot copy pixels from image file \"");
  pcVar13 = DeepScanLineInputFile::fileName(in);
  poVar12 = std::operator<<(poVar12,pcVar13);
  poVar12 = std::operator<<(poVar12,"\" to image file \"");
  pcVar13 = fileName(this);
  poVar12 = std::operator<<(poVar12,pcVar13);
  std::operator<<(poVar12,"\": the input needs to be a deep scanline image");
  pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(pAVar11,(stringstream *)&data);
  __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
DeepScanLineOutputFile::copyPixels (DeepScanLineInputFile &in)
{

    Lock lock (*_data->_streamData);

    //
    // Check if this file's and and the InputFile's
    // headers are compatible.
    //

    const Header &hdr = _data->header;
    const Header &inHdr = in.header();

    if(!inHdr.hasType() || inHdr.type()!=DEEPSCANLINE)
    {
        THROW (IEX_NAMESPACE::ArgExc, "Cannot copy pixels from image "
                            "file \"" << in.fileName() << "\" to image "
                            "file \"" << fileName() << "\": the input needs to be a deep scanline image");
    }
    if (!(hdr.dataWindow() == inHdr.dataWindow()))
        THROW (IEX_NAMESPACE::ArgExc, "Cannot copy pixels from image "
                            "file \"" << in.fileName() << "\" to image "
                            "file \"" << fileName() << "\". "
                            "The files have different data windows.");

    if (!(hdr.lineOrder() == inHdr.lineOrder()))
        THROW (IEX_NAMESPACE::ArgExc, "Quick pixel copy from image "
                            "file \"" << in.fileName() << "\" to image "
                            "file \"" << fileName() << "\" failed. "
                            "The files have different line orders.");

    if (!(hdr.compression() == inHdr.compression()))
        THROW (IEX_NAMESPACE::ArgExc, "Quick pixel copy from image "
                            "file \"" << in.fileName() << "\" to image "
                            "file \"" << fileName() << "\" failed. "
                            "The files use different compression methods.");

    if (!(hdr.channels() == inHdr.channels()))
        THROW (IEX_NAMESPACE::ArgExc, "Quick pixel copy from image "
                            "file \"" << in.fileName() << "\" to image "
                            "file \"" << fileName() << "\" failed.  "
                            "The files have different channel lists.");

    //
    // Verify that no pixel data have been written to this file yet.
    //

    const Box2i &dataWindow = hdr.dataWindow();

    if (_data->missingScanLines != dataWindow.max.y - dataWindow.min.y + 1)
        THROW (IEX_NAMESPACE::LogicExc, "Quick pixel copy from image "
                              "file \"" << in.fileName() << "\" to image "
                              "file \"" << fileName() << "\" failed. "
                              "\"" << fileName() << "\" already contains "
                              "pixel data.");

    //
    // Copy the pixel data.
    //

    vector<char> data(4096);
    
    while (_data->missingScanLines > 0)
    {
        Int64 dataSize = (Int64) data.size();
        in.rawPixelData(_data->currentScanLine, &data[0], dataSize);
        if(dataSize > data.size())
        {
            // block wasn't big enough - go again with enough memory this time
            data.resize(dataSize);
            in.rawPixelData(_data->currentScanLine, &data[0], dataSize);
        }

        // extract header from block to pass to writePixelData
        
        Int64 packedSampleCountSize = *(Int64 *) (&data[4]);
        Int64 packedDataSize = *(Int64 *) (&data[12]);
        Int64 unpackedDataSize = *(Int64 *) (&data[20]);
        const char * sampleCountTable = &data[0]+28;
        const char * pixelData = sampleCountTable + packedSampleCountSize;
        
        
        writePixelData (_data->_streamData, _data, lineBufferMinY (_data->currentScanLine,
                                               _data->minY,
                                               _data->linesInBuffer),
                        pixelData, packedDataSize, unpackedDataSize,sampleCountTable,packedSampleCountSize);

        _data->currentScanLine += (_data->lineOrder == INCREASING_Y)?
                                   _data->linesInBuffer: -_data->linesInBuffer;

        _data->missingScanLines -= _data->linesInBuffer;
    }
}